

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tpzgeoelrefpattern.h
# Opt level: O0

TPZGeoEl * __thiscall
TPZGeoElRefPattern<pzgeom::TPZGeoTriangle>::SubElement
          (TPZGeoElRefPattern<pzgeom::TPZGeoTriangle> *this,int is)

{
  bool bVar1;
  int iVar2;
  TPZRefPattern *this_00;
  ostream *this_01;
  void *this_02;
  long *plVar3;
  TPZGeoMesh *this_03;
  TPZGeoEl **ppTVar4;
  int in_ESI;
  TPZGeoEl *in_RDI;
  int nsubel;
  size_t in_stack_000003b8;
  char *in_stack_000003c0;
  TPZAutoPointer<TPZRefPattern> *in_stack_ffffffffffffffa0;
  TPZGeoEl *local_58;
  TPZAutoPointer<TPZRefPattern> *this_04;
  TPZAutoPointer<TPZRefPattern> local_20;
  int local_18;
  int local_14;
  TPZGeoEl *local_8;
  
  local_14 = in_ESI;
  bVar1 = ::TPZAutoPointer::operator_cast_to_bool((TPZAutoPointer *)&in_RDI[4].fFatherIndex);
  if (bVar1) {
    this_04 = &local_20;
    (**(code **)(*(long *)in_RDI + 0x2b0))();
    this_00 = TPZAutoPointer<TPZRefPattern>::operator->(this_04);
    iVar2 = TPZRefPattern::NSubElements(this_00);
    TPZAutoPointer<TPZRefPattern>::~TPZAutoPointer(in_stack_ffffffffffffffa0);
    local_18 = iVar2;
    if ((local_14 < 0) || (iVar2 <= local_14)) {
      this_01 = std::operator<<((ostream *)&std::cout,
                                "TPZGeoElRefPattern::SubElement index error is= ");
      this_02 = (void *)std::ostream::operator<<(this_01,local_14);
      std::ostream::operator<<(this_02,std::endl<char,std::char_traits<char>>);
      pzinternal::DebugStopImpl(in_stack_000003c0,in_stack_000003b8);
    }
    plVar3 = TPZVec<long>::operator[]((TPZVec<long> *)&in_RDI[4].fMesh,(long)local_14);
    if (*plVar3 == -1) {
      local_58 = (TPZGeoEl *)0x0;
    }
    else {
      this_03 = TPZGeoEl::Mesh(in_RDI);
      TPZGeoMesh::ElementVec(this_03);
      TPZVec<long>::operator[]((TPZVec<long> *)&in_RDI[4].fMesh,(long)local_14);
      ppTVar4 = TPZChunkVector<TPZGeoEl_*,_10>::operator[]
                          ((TPZChunkVector<TPZGeoEl_*,_10> *)this_00,(int64_t)this_04);
      local_58 = *ppTVar4;
    }
    local_8 = local_58;
  }
  else {
    local_8 = (TPZGeoEl *)0x0;
  }
  return local_8;
}

Assistant:

TPZGeoEl * TPZGeoElRefPattern<TGeo>::SubElement(int is) const {
	if (!fRefPattern) return 0;
	int nsubel = this->GetRefPattern()->NSubElements();
	if(is<0 || is>= nsubel){
		std::cout << "TPZGeoElRefPattern::SubElement index error is= " << is << std::endl;
        DebugStop();
	}
	return (fSubEl[is] == -1) ? 0 : this->Mesh()->ElementVec()[fSubEl[is]];
}